

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::Hub::~Hub(Hub *this)

{
  bool bVar1;
  reference ppSVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  int *terminationPipes;
  Hub *this_local;
  
  this->_vptr_Hub = (_func_int **)&PTR__Hub_00151258;
  it._M_node = (_Base_ptr)this->hTerminate;
  close((it._M_node)->_M_color);
  close(*(int *)&(it._M_node)->field_0x4);
  if (it._M_node != (_Base_ptr)0x0) {
    operator_delete__(it._M_node);
  }
  local_20._M_node =
       (_Base_ptr)
       std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::
       begin(&this->streams);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
         ::end(&this->streams);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<Dashel::Stream_*>::operator*(&local_20);
    if (*ppSVar2 != (Stream *)0x0) {
      (*(*ppSVar2)->_vptr_Stream[1])();
    }
    std::_Rb_tree_const_iterator<Dashel::Stream_*>::operator++(&local_20);
  }
  pthread_mutex_destroy((pthread_mutex_t *)this->streamsLock);
  if (this->streamsLock != (void *)0x0) {
    operator_delete(this->streamsLock,0x28);
  }
  std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::~set
            (&this->dataStreams);
  std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::~set
            (&this->streams);
  return;
}

Assistant:

Hub::~Hub()
	{
		int* terminationPipes = (int*)hTerminate;
		close(terminationPipes[0]);
		close(terminationPipes[1]);
		delete[] terminationPipes;

		for (StreamsSet::iterator it = streams.begin(); it != streams.end(); ++it)
			delete *it;

		pthread_mutex_destroy((pthread_mutex_t*)streamsLock);

		delete (pthread_mutex_t*)streamsLock;
	}